

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::ScopedProperty
          (ByteCodeWriter *this,OpCode op,RegSlot value,PropertyIdIndexType propertyIdIndex,
          bool forceStrictMode)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  OpCode op_00;
  FunctionBody *this_00;
  undefined3 in_register_00000081;
  RegSlot local_3c;
  PropertyIdIndexType local_38;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000081,forceStrictMode);
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x33);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5ba,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00890d72;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00890d72;
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
    }
    value_00 = FunctionBody::MapRegSlot(this_00,value);
    if ((0x3d < op - 0x4d) || ((0x2400000000000001U >> ((ulong)(op - 0x4d) & 0x3f) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x5c8,"(false)",
                                  "The specified OpCode is not intended for scoped field-access");
      if (!bVar2) goto LAB_00890d72;
      *puVar3 = 0;
    }
    op_00 = op;
    if ((char)local_34 != '\0') {
      op_00 = ScopedDeleteFldStrict;
    }
    if ((*(ushort *)
          &(this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
        0x100) != 0) {
      op_00 = ScopedDeleteFldStrict;
    }
    if (op != ScopedDeleteFld) {
      op_00 = op;
    }
    bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,op_00,value_00,propertyIdIndex);
    if (!bVar2) {
      bVar2 = TryWriteElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,op_00,value_00,propertyIdIndex);
      if (!bVar2) {
        local_3c = value_00;
        local_38 = propertyIdIndex;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op_00,this);
        Data::Write(&this->m_byteCodeData,&local_3c,8);
      }
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_00890d72:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::ScopedProperty(OpCode op, RegSlot value, PropertyIdIndexType propertyIdIndex, bool forceStrictMode)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementScopedC);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

#if DBG
        switch (op)
        {
        case OpCode::ScopedDeleteFld:
        case OpCode::ScopedEnsureNoRedeclFld:
        case OpCode::ScopedInitFunc:
            break;


        default:
            AssertMsg(false, "The specified OpCode is not intended for scoped field-access");
            break;
        }
#endif

        if (this->m_functionWrite->GetIsStrictMode() || forceStrictMode)
        {
            if (op == OpCode::ScopedDeleteFld)
            {
                op = OpCode::ScopedDeleteFldStrict;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementScopedC, op, value, propertyIdIndex);
    }